

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O0

Vector4f __thiscall Vector4f::homogenized(Vector4f *this)

{
  float *in_RSI;
  Vector4f *in_RDI;
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  Vector4f VVar5;
  
  if ((in_RSI[3] != 0.0) || (NAN(in_RSI[3]))) {
    auVar2._0_4_ = *in_RSI / in_RSI[3];
    auVar2._4_12_ = SUB6012((undefined1  [60])0x0,0);
    uVar1 = auVar2._0_8_;
    auVar4._0_4_ = in_RSI[1] / in_RSI[3];
    auVar4._4_12_ = SUB6012((undefined1  [60])0x0,0);
    uVar3 = auVar4._0_8_;
    Vector4f(in_RDI,auVar2._0_4_,auVar4._0_4_,in_RSI[2] / in_RSI[3],1.0);
  }
  else {
    uVar1 = (ulong)(uint)*in_RSI;
    uVar3 = (ulong)(uint)in_RSI[1];
    Vector4f(in_RDI,*in_RSI,in_RSI[1],in_RSI[2],in_RSI[3]);
  }
  VVar5.m_elements[2] = (float)(int)uVar3;
  VVar5.m_elements[3] = (float)(int)(uVar3 >> 0x20);
  VVar5.m_elements[0] = (float)(int)uVar1;
  VVar5.m_elements[1] = (float)(int)(uVar1 >> 0x20);
  return (Vector4f)VVar5.m_elements;
}

Assistant:

Vector4f Vector4f::homogenized() const
{
	if( m_elements[3] != 0 )
	{
		return Vector4f
			(
				m_elements[0] / m_elements[3],
				m_elements[1] / m_elements[3],
				m_elements[2] / m_elements[3],
				1
			);
	}
	else
	{
		return Vector4f
			(
				m_elements[0],
				m_elements[1],
				m_elements[2],
				m_elements[3]
			);
	}
}